

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchCounter_Test::TestBody
          (CountdownLatchTest_TestCountdownLatchCounter_Test *this)

{
  bool bVar1;
  CountdownLatch *this_00;
  char *pcVar2;
  AssertHelper local_148;
  Message local_140;
  undefined4 local_138;
  uint local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_6;
  Message local_118;
  undefined4 local_110;
  uint local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_5;
  Message local_f0;
  uint local_e8 [2];
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_4;
  Message local_c8;
  uint local_c0 [2];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_3;
  Message local_a0;
  uint local_98 [2];
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  uint local_70 [2];
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_50;
  Message local_48;
  uint local_40 [2];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  CountdownLatch *latch;
  CountdownLatchTest_TestCountdownLatchCounter_Test *this_local;
  
  this_00 = (CountdownLatch *)operator_new(0x60);
  bidfx_public_api::tools::CountdownLatch::CountdownLatch(this_00,5);
  local_40[1] = 5;
  local_40[0] = bidfx_public_api::tools::CountdownLatch::GetCount();
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_38,"5","latch->GetCount()",(int *)(local_40 + 1),local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(&local_48);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    bidfx_public_api::tools::CountdownLatch::CountDown();
    local_70[1] = 4;
    local_70[0] = bidfx_public_api::tools::CountdownLatch::GetCount();
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((EqHelper<false> *)local_68,"4","latch->GetCount()",(int *)(local_70 + 1),local_70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
    if (!bVar1) {
      testing::Message::Message(&local_78);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                 ,0x22,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_78);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      bidfx_public_api::tools::CountdownLatch::CountDown();
      local_98[1] = 3;
      local_98[0] = bidfx_public_api::tools::CountdownLatch::GetCount();
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((EqHelper<false> *)local_90,"3","latch->GetCount()",(int *)(local_98 + 1),local_98)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
      if (!bVar1) {
        testing::Message::Message(&local_a0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                   ,0x24,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_a0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        bidfx_public_api::tools::CountdownLatch::CountDown();
        local_c0[1] = 2;
        local_c0[0] = bidfx_public_api::tools::CountdownLatch::GetCount();
        testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                  ((EqHelper<false> *)local_b8,"2","latch->GetCount()",(int *)(local_c0 + 1),
                   local_c0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
        if (!bVar1) {
          testing::Message::Message(&local_c8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                     ,0x26,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_c8);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          bidfx_public_api::tools::CountdownLatch::CountDown();
          local_e8[1] = 1;
          local_e8[0] = bidfx_public_api::tools::CountdownLatch::GetCount();
          testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                    ((EqHelper<false> *)local_e0,"1","latch->GetCount()",(int *)(local_e8 + 1),
                     local_e8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
          if (!bVar1) {
            testing::Message::Message(&local_f0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                       ,0x28,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_f0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_f0);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            bidfx_public_api::tools::CountdownLatch::CountDown();
            local_10c = 0;
            local_110 = bidfx_public_api::tools::CountdownLatch::GetCount();
            testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                      ((char *)local_108,"0",(int *)"latch->GetCount()",&local_10c,&local_110);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
            if (!bVar1) {
              testing::Message::Message(&local_118);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                         ,0x2a,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_118);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_118);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              bidfx_public_api::tools::CountdownLatch::CountDown();
              local_134 = 0;
              local_138 = bidfx_public_api::tools::CountdownLatch::GetCount();
              testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                        ((char *)local_130,"0",(int *)"latch->GetCount()",&local_134,&local_138);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
              if (!bVar1) {
                testing::Message::Message(&local_140);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
                testing::internal::AssertHelper::AssertHelper
                          (&local_148,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                           ,0x2c,pcVar2);
                testing::internal::AssertHelper::operator=(&local_148,&local_140);
                testing::internal::AssertHelper::~AssertHelper(&local_148);
                testing::Message::~Message(&local_140);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchCounter)
{
    auto latch = new CountdownLatch(5);
    ASSERT_EQ(5, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(4, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(3, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(2, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(1, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(0, latch->GetCount());
    latch->CountDown();
    ASSERT_EQ(0, latch->GetCount());
}